

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_charset_filter_module.c
# Opt level: O3

ngx_int_t ngx_http_charset_body_filter(ngx_http_request_t *r,ngx_chain_t *in)

{
  byte bVar1;
  byte *pbVar2;
  ushort uVar3;
  ushort uVar4;
  uint32_t uVar5;
  long lVar6;
  u_char *puVar7;
  ngx_buf_t *pnVar8;
  ulong uVar9;
  ngx_chain_t *pnVar10;
  ngx_chain_t *pnVar11;
  ngx_chain_t *pnVar12;
  ngx_int_t nVar13;
  ushort uVar14;
  ushort uVar15;
  ulong uVar16;
  u_char *size;
  byte *pbVar17;
  ngx_chain_t **ppnVar18;
  ngx_chain_t **ppnVar19;
  u_char uVar20;
  ngx_chain_t *pnVar21;
  byte *pbVar22;
  ngx_http_charset_ctx_t *ctx;
  byte *pbVar23;
  ngx_buf_t *pnVar24;
  size_t sVar25;
  bool bVar26;
  ngx_chain_t *local_90;
  ngx_chain_t *out;
  ngx_chain_t *local_80;
  ngx_chain_t *local_78;
  ngx_chain_t *local_70;
  u_char *src;
  ngx_buf_t *local_60;
  ngx_http_request_t *local_58;
  ngx_chain_t *local_50;
  ngx_pool_t *local_48;
  ngx_buf_t *local_40;
  ngx_http_charset_ctx_t *local_38;
  
  ctx = (ngx_http_charset_ctx_t *)r->ctx[ngx_http_charset_filter_module.ctx_index];
  if ((ctx == (ngx_http_charset_ctx_t *)0x0) || (ctx->table == (u_char *)0x0)) {
LAB_00161ee8:
    nVar13 = (*ngx_http_next_body_filter)(r,in);
    return nVar13;
  }
  if (((ctx->field_0x46 & 3) == 0) && (ctx->busy == (ngx_chain_t *)0x0)) {
    pnVar11 = in;
    if (in != (ngx_chain_t *)0x0) {
LAB_00161e9d:
      pnVar8 = pnVar11->buf;
      pbVar22 = pnVar8->pos;
      pbVar2 = pnVar8->last;
      if (pbVar22 < pbVar2) {
        puVar7 = ctx->table;
        do {
          if (*pbVar22 != puVar7[*pbVar22]) goto LAB_00161ec3;
          pbVar22 = pbVar22 + 1;
        } while (pbVar22 != pbVar2);
      }
      goto LAB_00161edf;
    }
    goto LAB_00161ee8;
  }
  local_90 = (ngx_chain_t *)0x0;
  if (in != (ngx_chain_t *)0x0) {
    out = (ngx_chain_t *)&ctx->field_0x44;
    local_78 = (ngx_chain_t *)ctx->saved;
    ppnVar18 = &local_90;
    local_58 = r;
    local_38 = ctx;
LAB_0016147c:
    pnVar8 = in->buf;
    if ((pnVar8->field_0x48 & 7) == 0) {
      lVar6 = pnVar8->file_last - pnVar8->file_pos;
    }
    else {
      lVar6 = (long)pnVar8->last - (long)pnVar8->pos;
    }
    if (lVar6 != 0) {
      local_48 = r->pool;
      local_40 = pnVar8;
      if ((*(uint *)&out->buf >> 0x11 & 1) == 0) {
        local_50 = (ngx_chain_t *)pnVar8->pos;
        uVar9 = ctx->saved_len;
        local_70 = local_50;
        if (uVar9 == 0) {
          pnVar11 = (ngx_chain_t *)pnVar8->last;
          if (local_50 < pnVar11) {
            lVar6 = 0;
            pnVar12 = local_50;
            pnVar21 = local_50;
            do {
              if ((char)*(u_char *)&pnVar12->buf < '\0') {
                if ((ulong)-lVar6 < 0x201) {
                  puVar7 = (u_char *)((long)pnVar11 + (-(long)pnVar21 - lVar6));
                  pnVar11 = (ngx_chain_t *)0x0;
                  local_70 = local_50;
                  pnVar12 = local_50;
                }
                else {
                  local_70 = pnVar12;
                  pnVar10 = ngx_http_charset_get_buf(local_48,local_38);
                  if (pnVar10 == (ngx_chain_t *)0x0) goto LAB_00161aa7;
                  src = (u_char *)pnVar10->buf;
                  uVar14 = *(ushort *)&local_40->field_0x48 & 1;
                  uVar3 = (ushort)*(undefined4 *)&((ngx_buf_t *)src)->field_0x48;
                  *(ushort *)&((ngx_buf_t *)src)->field_0x48 = uVar3 & 0xfffe | uVar14;
                  uVar4 = *(ushort *)&local_40->field_0x48 & 2;
                  *(ushort *)&((ngx_buf_t *)src)->field_0x48 = uVar3 & 0xfffc | uVar14 | uVar4;
                  uVar15 = *(ushort *)&local_40->field_0x48 & 4;
                  *(ushort *)&((ngx_buf_t *)src)->field_0x48 =
                       uVar3 & 0xfff8 | uVar14 | uVar4 | uVar15;
                  *(ushort *)&((ngx_buf_t *)src)->field_0x48 =
                       uVar3 & 0xffd8 | uVar14 | uVar4 | uVar15 |
                       *(ushort *)&local_40->field_0x48 & 0x20;
                  ((ngx_buf_t *)src)->pos = local_40->pos;
                  ((ngx_buf_t *)src)->last = (u_char *)pnVar12;
                  pnVar10->buf = (ngx_buf_t *)src;
                  pnVar10->next = (ngx_chain_t *)0x0;
                  puVar7 = local_40->last + -(long)pnVar21;
                  local_80 = pnVar12;
                  uVar5 = ngx_utf8_decode((u_char **)&local_80,(size_t)puVar7);
                  pnVar11 = pnVar10;
                  if (uVar5 == 0xfffffffe) {
                    memcpy(local_78,pnVar12,(size_t)puVar7);
                    local_38->saved_len = (size_t)puVar7;
                    *(ngx_buf_t **)(src + 0x40) = local_40;
                    r = local_58;
                    ctx = local_38;
                    goto LAB_00161ce4;
                  }
                }
                local_50 = pnVar12;
                ctx = local_38;
                size = puVar7 + 10;
                if ((u_char *)0x9 < puVar7) {
                  size = puVar7;
                }
                pnVar12 = ngx_http_charset_get_buffer(local_48,local_38,(size_t)size);
                if (pnVar12 == (ngx_chain_t *)0x0) {
                  pnVar10 = (ngx_chain_t *)0x0;
                  r = local_58;
                  goto LAB_00161ce4;
                }
                pnVar10 = pnVar12;
                if (pnVar11 != (ngx_chain_t *)0x0) {
                  pnVar11->next = pnVar12;
                  pnVar10 = pnVar11;
                }
                pnVar8 = pnVar12->buf;
                puVar7 = pnVar8->pos;
                pnVar11 = local_50;
                pnVar24 = local_40;
                src = (u_char *)pnVar12;
                goto LAB_00161b4e;
              }
              pnVar12 = (ngx_chain_t *)((long)&pnVar12->buf + 1);
              pnVar21 = (ngx_chain_t *)((long)&pnVar21->buf + 1);
              lVar6 = lVar6 + -1;
              local_70 = pnVar12;
            } while (pnVar12 != pnVar11);
          }
          pnVar10 = ngx_alloc_chain_link(local_48);
          if (pnVar10 == (ngx_chain_t *)0x0) {
LAB_00161aa7:
            pnVar10 = (ngx_chain_t *)0x0;
            r = local_58;
            ctx = local_38;
          }
          else {
            pnVar10->buf = local_40;
            pnVar10->next = (ngx_chain_t *)0x0;
            r = local_58;
            ctx = local_38;
          }
        }
        else {
          if ((local_48->log->log_level & 0x100) != 0) {
            ngx_log_error_core(8,local_48->log,0,"http charset utf saved: %z",uVar9);
            uVar9 = ctx->saved_len;
          }
          if (uVar9 < 4) {
            puVar7 = (u_char *)((long)&local_50->buf + 1);
            *(u_char *)((long)&local_78->buf + uVar9) = *(u_char *)&local_50->buf;
            if (puVar7 == pnVar8->last) {
              bVar26 = true;
            }
            else {
              do {
                uVar16 = uVar9;
                if (uVar16 == 3) {
                  uVar9 = 4;
                  break;
                }
                uVar20 = *puVar7;
                puVar7 = puVar7 + 1;
                ctx->saved[uVar16 + 1] = uVar20;
                uVar9 = uVar16 + 1;
              } while (puVar7 != pnVar8->last);
              bVar26 = uVar16 < 3;
            }
          }
          else {
            bVar26 = false;
          }
          local_80 = local_78;
          uVar5 = ngx_utf8_decode((u_char **)&local_80,uVar9);
          ctx = local_38;
          r = local_58;
          if (uVar5 < 0x10000) {
            if (*(long *)(local_38->table + (ulong)(uVar5 >> 8) * 8) == 0) {
              uVar20 = '\0';
            }
            else {
              uVar20 = *(u_char *)
                        (*(long *)(local_38->table + (ulong)(uVar5 >> 8) * 8) +
                        (ulong)(uVar5 & 0xff));
            }
          }
          else {
            if (bVar26 && uVar5 == 0xfffffffe) {
              pnVar10 = ngx_http_charset_get_buf(local_48,local_38);
              if (pnVar10 == (ngx_chain_t *)0x0) {
LAB_00161cdd:
                pnVar10 = (ngx_chain_t *)0x0;
                r = local_58;
              }
              else {
                pnVar8 = pnVar10->buf;
                pnVar8->pos = local_40->pos;
                pnVar8->last = local_40->last;
                pnVar8->field_0x48 = pnVar8->field_0x48 | 0x40;
                pnVar8->shadow = local_40;
                memcpy((u_char *)((long)&local_78->buf + ctx->saved_len),local_50,uVar9);
                ctx->saved_len = ctx->saved_len + uVar9;
                r = local_58;
              }
              goto LAB_00161ce4;
            }
            uVar20 = '\0';
          }
          uVar9 = (long)local_40->last - (long)local_40->pos;
          sVar25 = uVar9 + 10;
          if (9 < uVar9) {
            sVar25 = uVar9;
          }
          pnVar10 = ngx_http_charset_get_buffer(local_48,local_38,sVar25);
          ctx = local_38;
          pnVar24 = local_40;
          if (pnVar10 == (ngx_chain_t *)0x0) {
            pnVar10 = (ngx_chain_t *)0x0;
          }
          else {
            pnVar8 = pnVar10->buf;
            puVar7 = pnVar8->pos;
            if (uVar20 == '\0') {
              if (uVar5 == 0xfffffffe) {
                *puVar7 = '?';
                if ((local_48->log->log_level & 0x100) != 0) {
                  local_60 = pnVar8;
                  ngx_log_error_core(8,local_48->log,0,"http charset invalid utf 0");
                  pnVar8 = local_60;
                }
                puVar7 = puVar7 + 1;
                local_80 = out;
              }
              else if (uVar5 < 0x110000) {
                puVar7 = ngx_sprintf(puVar7,"&#%uD;",(ulong)uVar5);
                pnVar24 = local_40;
              }
              else {
                *puVar7 = '?';
                puVar7 = puVar7 + 1;
                if ((local_48->log->log_level & 0x100) != 0) {
                  ngx_log_error_core(8,local_48->log,0,"http charset invalid utf 1");
                  pnVar24 = local_40;
                }
              }
            }
            else {
              *puVar7 = uVar20;
              puVar7 = puVar7 + 1;
            }
            local_70 = (ngx_chain_t *)
                       ((long)local_50 +
                       ((long)local_80 - (long)((long)&local_78->buf + ctx->saved_len)));
            ctx->saved_len = 0;
            pnVar11 = local_70;
            src = (u_char *)pnVar10;
LAB_00161b4e:
            if (pnVar11 < (ngx_chain_t *)pnVar24->last) {
              local_50 = (ngx_chain_t *)ctx->table;
              src = src + 8;
              do {
                if ((ulong)((long)pnVar8->end - (long)puVar7) < 10) {
                  pnVar8->last = puVar7;
                  pnVar11 = ngx_http_charset_get_buffer
                                      (local_48,ctx,(size_t)(pnVar24->last + (10 - (long)pnVar11)));
                  if (pnVar11 == (ngx_chain_t *)0x0) goto LAB_00161cdd;
                  *(ngx_chain_t **)src = pnVar11;
                  src = (u_char *)&pnVar11->next;
                  pnVar8 = pnVar11->buf;
                  puVar7 = pnVar8->pos;
                  pnVar11 = local_70;
                }
                if ((char)*(u_char *)&pnVar11->buf < '\0') {
                  sVar25 = (long)pnVar24->last - (long)pnVar11;
                  local_60 = pnVar8;
                  uVar5 = ngx_utf8_decode((u_char **)&local_70,sVar25);
                  pnVar24 = local_40;
                  pnVar8 = local_60;
                  if (uVar5 < 0x10000) {
                    if (((&local_50->buf)[uVar5 >> 8] == (ngx_buf_t *)0x0) ||
                       (uVar20 = *(u_char *)
                                  ((long)&(&local_50->buf)[uVar5 >> 8]->pos + (ulong)(uVar5 & 0xff))
                       , uVar20 == '\0')) {
                      puVar7 = ngx_sprintf(puVar7,"&#%uD;",(ulong)uVar5);
                      pnVar8 = local_60;
                      pnVar24 = local_40;
                    }
                    else {
                      *puVar7 = uVar20;
                      puVar7 = puVar7 + 1;
                    }
                  }
                  else {
                    if (uVar5 == 0xfffffffe) {
                      memcpy(local_78,local_70,sVar25);
                      ctx->saved_len = sVar25;
                      pnVar8 = local_60;
                      pnVar24 = local_40;
                      if (local_60->pos == puVar7) {
                        *(ushort *)&local_60->field_0x48 =
                             (ushort)*(undefined4 *)&local_60->field_0x48 & 0xffbe | 0x40;
                      }
                      break;
                    }
                    if (uVar5 < 0x110000) {
                      puVar7 = ngx_sprintf(puVar7,"&#%uD;",(ulong)uVar5);
                      pnVar8 = local_60;
                    }
                    else {
                      *puVar7 = '?';
                      puVar7 = puVar7 + 1;
                      if ((local_48->log->log_level & 0x100) != 0) {
                        ngx_log_error_core(8,local_48->log,0,"http charset invalid utf 2");
                        pnVar8 = local_60;
                      }
                    }
                  }
                }
                else {
                  local_70 = (ngx_chain_t *)((long)&pnVar11->buf + 1);
                  *puVar7 = *(u_char *)&pnVar11->buf;
                  puVar7 = puVar7 + 1;
                }
                pnVar11 = local_70;
              } while (local_70 < (ngx_chain_t *)pnVar24->last);
            }
            pnVar8->last = puVar7;
            uVar14 = *(ushort *)&pnVar24->field_0x48 & 0x80;
            uVar3 = (ushort)*(undefined4 *)&pnVar8->field_0x48;
            *(ushort *)&pnVar8->field_0x48 = uVar3 & 0xff7f | uVar14;
            uVar4 = *(ushort *)&pnVar24->field_0x48 & 0x100;
            *(ushort *)&pnVar8->field_0x48 = uVar3 & 0xfe7f | uVar14 | uVar4;
            *(ushort *)&pnVar8->field_0x48 =
                 uVar3 & 0xfe5f | uVar14 | uVar4 | *(ushort *)&pnVar24->field_0x48 & 0x20;
            pnVar8->shadow = pnVar24;
            r = local_58;
          }
        }
        goto LAB_00161ce4;
      }
      pbVar22 = pnVar8->pos;
      pbVar2 = pnVar8->last;
      if (pbVar22 < pbVar2) {
        pnVar11 = (ngx_chain_t *)local_38->table;
        uVar9 = (long)pbVar2 - (long)pbVar22;
        uVar16 = 0;
        pbVar17 = pbVar22;
        pbVar23 = pbVar22;
        do {
          if (*(u_char *)((long)&pnVar11->buf + (ulong)*pbVar23 * 4) != '\x01') {
            local_50 = pnVar11;
            if (uVar16 < 0x201) {
              pnVar11 = ngx_http_charset_get_buffer
                                  (local_48,local_38,
                                   uVar16 + (uVar9 >> 1) *
                                            ((ulong)(*(uint *)&out->buf & 0xffff) + 1));
              pnVar10 = pnVar11;
              if (pnVar11 == (ngx_chain_t *)0x0) goto LAB_00161e77;
            }
            else {
              pnVar10 = ngx_http_charset_get_buf(local_48,local_38);
              if (pnVar10 == (ngx_chain_t *)0x0) goto LAB_00161e77;
              pnVar8 = pnVar10->buf;
              uVar14 = *(ushort *)&local_40->field_0x48 & 1;
              uVar3 = (ushort)*(undefined4 *)&pnVar8->field_0x48;
              *(ushort *)&pnVar8->field_0x48 = uVar3 & 0xfffe | uVar14;
              uVar4 = *(ushort *)&local_40->field_0x48 & 2;
              *(ushort *)&pnVar8->field_0x48 = uVar3 & 0xfffc | uVar14 | uVar4;
              uVar15 = *(ushort *)&local_40->field_0x48 & 4;
              *(ushort *)&pnVar8->field_0x48 = uVar3 & 0xfff8 | uVar14 | uVar4 | uVar15;
              *(ushort *)&pnVar8->field_0x48 =
                   uVar3 & 0xffd8 | uVar14 | uVar4 | uVar15 |
                   *(ushort *)&local_40->field_0x48 & 0x20;
              pnVar8->pos = local_40->pos;
              pnVar8->last = pbVar23;
              pnVar10->buf = pnVar8;
              pnVar10->next = (ngx_chain_t *)0x0;
              pnVar11 = ngx_http_charset_get_buffer
                                  (local_48,local_38,
                                   ((ulong)*(ushort *)&local_38->field_0x44 + 1) *
                                   ((ulong)((long)local_40->last - (long)pbVar17) >> 1));
              if (pnVar11 == (ngx_chain_t *)0x0) goto LAB_00161e77;
              pnVar10->next = pnVar11;
              pbVar22 = pbVar23;
            }
            pnVar8 = pnVar11->buf;
            puVar7 = pnVar8->pos;
            if (local_40->last <= pbVar22) goto LAB_00161809;
            ppnVar19 = &pnVar11->next;
            local_60 = (ngx_buf_t *)((long)&local_50->buf + 1);
            pnVar11 = local_50;
            goto LAB_00161769;
          }
          pbVar23 = pbVar23 + 1;
          pbVar17 = pbVar17 + 1;
          uVar16 = uVar16 + 1;
          uVar9 = uVar9 - 1;
        } while (pbVar23 != pbVar2);
      }
      pnVar10 = ngx_alloc_chain_link(local_48);
      if (pnVar10 == (ngx_chain_t *)0x0) {
LAB_00161e77:
        *ppnVar18 = (ngx_chain_t *)0x0;
        return -1;
      }
      pnVar10->buf = local_40;
      pnVar10->next = (ngx_chain_t *)0x0;
      *ppnVar18 = pnVar10;
      r = local_58;
      ctx = local_38;
      goto LAB_00161cf1;
    }
    pnVar11 = ngx_alloc_chain_link(r->pool);
    *ppnVar18 = pnVar11;
    if (pnVar11 == (ngx_chain_t *)0x0) {
      return -1;
    }
    pnVar11->buf = pnVar8;
    (*ppnVar18)->next = (ngx_chain_t *)0x0;
    pnVar11 = *ppnVar18;
    goto LAB_00161cfe;
  }
  nVar13 = (*ngx_http_next_body_filter)(r,(ngx_chain_t *)0x0);
LAB_00161db7:
  pnVar11 = ctx->busy;
LAB_00161dbb:
  pnVar12 = pnVar11;
  if (pnVar11 == (ngx_chain_t *)0x0) {
    return nVar13;
  }
LAB_00161dc7:
  do {
    pnVar8 = pnVar12->buf;
    if ((pnVar8->field_0x48 & 7) == 0) {
      lVar6 = pnVar8->file_last - pnVar8->file_pos;
    }
    else {
      lVar6 = (long)pnVar8->last - (long)pnVar8->pos;
    }
    if (lVar6 != 0) {
      return nVar13;
    }
    pnVar11 = pnVar12->next;
    ctx->busy = pnVar11;
    if ((ngx_module_t *)pnVar8->tag == &ngx_http_charset_filter_module) {
      pnVar24 = pnVar8->shadow;
      if (pnVar24 != (ngx_buf_t *)0x0) {
        pnVar24->pos = pnVar24->last;
      }
      ppnVar18 = &ctx->free_buffers;
      if (pnVar8->pos == (u_char *)0x0) {
        ppnVar18 = &ctx->free_bufs;
      }
      pnVar12->next = *ppnVar18;
      *ppnVar18 = pnVar12;
    }
    pnVar12 = pnVar11;
  } while (pnVar11 != (ngx_chain_t *)0x0);
  return nVar13;
LAB_00161ec3:
  do {
    bVar1 = puVar7[*pbVar22];
    if (*pbVar22 != bVar1) {
      *pbVar22 = bVar1;
    }
    pbVar22 = pbVar22 + 1;
  } while (pbVar22 < pbVar2);
  pnVar8->field_0x48 = pnVar8->field_0x48 & 0xef;
LAB_00161edf:
  ppnVar18 = &pnVar11->next;
  pnVar11 = *ppnVar18;
  if (*ppnVar18 == (ngx_chain_t *)0x0) goto LAB_00161ee8;
  goto LAB_00161e9d;
  while( true ) {
    if (uVar9 != 0) {
      uVar16 = 0;
      do {
        puVar7[uVar16] = *(u_char *)((long)&local_60->pos + uVar16 + (ulong)bVar1 * 4);
        uVar16 = uVar16 + 1;
      } while (uVar9 != uVar16);
      puVar7 = puVar7 + uVar16;
    }
    if (local_40->last <= pbVar22) break;
LAB_00161769:
    bVar1 = *pbVar22;
    pbVar22 = pbVar22 + 1;
    uVar9 = (ulong)*(u_char *)((long)&pnVar11->buf + (ulong)bVar1 * 4);
    if ((ulong)((long)pnVar8->end - (long)puVar7) < uVar9) {
      pnVar8->last = puVar7;
      uVar16 = (ulong)((long)local_40->last - (long)pbVar22) >> 1;
      src = pbVar22;
      pnVar11 = ngx_http_charset_get_buffer
                          (local_48,local_38,
                           *(ushort *)&local_38->field_0x44 * uVar16 + uVar16 + uVar9);
      if (pnVar11 == (ngx_chain_t *)0x0) goto LAB_00161e77;
      *ppnVar19 = pnVar11;
      ppnVar19 = &pnVar11->next;
      pnVar8 = pnVar11->buf;
      puVar7 = pnVar8->pos;
      pnVar11 = local_50;
      pbVar22 = src;
    }
  }
LAB_00161809:
  pnVar8->last = puVar7;
  uVar14 = *(ushort *)&local_40->field_0x48 & 0x80;
  uVar3 = (ushort)*(undefined4 *)&pnVar8->field_0x48;
  *(ushort *)&pnVar8->field_0x48 = uVar3 & 0xff7f | uVar14;
  uVar4 = *(ushort *)&local_40->field_0x48 & 0x100;
  *(ushort *)&pnVar8->field_0x48 = uVar3 & 0xfe7f | uVar14 | uVar4;
  *(ushort *)&pnVar8->field_0x48 =
       uVar3 & 0xfe5f | uVar14 | uVar4 | *(ushort *)&local_40->field_0x48 & 0x20;
  pnVar8->shadow = local_40;
  r = local_58;
  ctx = local_38;
LAB_00161ce4:
  *ppnVar18 = pnVar10;
  if (pnVar10 == (ngx_chain_t *)0x0) {
    return -1;
  }
LAB_00161cf1:
  do {
    pnVar11 = pnVar10;
    pnVar10 = pnVar11->next;
  } while (pnVar11->next != (ngx_chain_t *)0x0);
LAB_00161cfe:
  pnVar12 = local_90;
  ppnVar18 = &pnVar11->next;
  in = in->next;
  if (in == (ngx_chain_t *)0x0) goto LAB_00161e36;
  goto LAB_0016147c;
LAB_00161e36:
  nVar13 = (*ngx_http_next_body_filter)(r,local_90);
  if (pnVar12 == (ngx_chain_t *)0x0) goto LAB_00161db7;
  pnVar11 = ctx->busy;
  pnVar21 = pnVar11;
  if (pnVar11 == (ngx_chain_t *)0x0) {
    ctx->busy = pnVar12;
    goto LAB_00161dc7;
  }
  do {
    pnVar10 = pnVar21;
    pnVar21 = pnVar10->next;
  } while (pnVar21 != (ngx_chain_t *)0x0);
  pnVar10->next = pnVar12;
  goto LAB_00161dbb;
}

Assistant:

static ngx_int_t
ngx_http_charset_body_filter(ngx_http_request_t *r, ngx_chain_t *in)
{
    ngx_int_t                rc;
    ngx_buf_t               *b;
    ngx_chain_t             *cl, *out, **ll;
    ngx_http_charset_ctx_t  *ctx;

    ctx = ngx_http_get_module_ctx(r, ngx_http_charset_filter_module);

    if (ctx == NULL || ctx->table == NULL) {
        return ngx_http_next_body_filter(r, in);
    }

    if ((ctx->to_utf8 || ctx->from_utf8) || ctx->busy) {

        out = NULL;
        ll = &out;

        for (cl = in; cl; cl = cl->next) {
            b = cl->buf;

            if (ngx_buf_size(b) == 0) {

                *ll = ngx_alloc_chain_link(r->pool);
                if (*ll == NULL) {
                    return NGX_ERROR;
                }

                (*ll)->buf = b;
                (*ll)->next = NULL;

                ll = &(*ll)->next;

                continue;
            }

            if (ctx->to_utf8) {
                *ll = ngx_http_charset_recode_to_utf8(r->pool, b, ctx);

            } else {
                *ll = ngx_http_charset_recode_from_utf8(r->pool, b, ctx);
            }

            if (*ll == NULL) {
                return NGX_ERROR;
            }

            while (*ll) {
                ll = &(*ll)->next;
            }
        }

        rc = ngx_http_next_body_filter(r, out);

        if (out) {
            if (ctx->busy == NULL) {
                ctx->busy = out;

            } else {
                for (cl = ctx->busy; cl->next; cl = cl->next) { /* void */ }
                cl->next = out;
            }
        }

        while (ctx->busy) {

            cl = ctx->busy;
            b = cl->buf;

            if (ngx_buf_size(b) != 0) {
                break;
            }

            ctx->busy = cl->next;

            if (b->tag != (ngx_buf_tag_t) &ngx_http_charset_filter_module) {
                continue;
            }

            if (b->shadow) {
                b->shadow->pos = b->shadow->last;
            }

            if (b->pos) {
                cl->next = ctx->free_buffers;
                ctx->free_buffers = cl;
                continue;
            }

            cl->next = ctx->free_bufs;
            ctx->free_bufs = cl;
        }

        return rc;
    }

    for (cl = in; cl; cl = cl->next) {
        (void) ngx_http_charset_recode(cl->buf, ctx->table);
    }

    return ngx_http_next_body_filter(r, in);
}